

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O1

void helics::helicsGetVector(string_view val,vector<double,_std::allocator<double>_> *data)

{
  char cVar1;
  iterator iVar2;
  double *pdVar3;
  uint uVar4;
  int iVar5;
  void *pvVar6;
  size_type sVar7;
  size_type sVar8;
  char *pcVar9;
  ulong uVar10;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  utilities *in_XMM1_Qa;
  string_view V;
  string_view trimCharacters;
  string_view val_00;
  basic_string_view<char,_std::char_traits<char>_> vstr;
  double vectorVal;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  utilities *local_58;
  utilities *local_50;
  char *local_48;
  utilities *local_40;
  double local_38;
  char *extraout_RDX;
  
  local_68._M_str = val._M_str;
  local_68._M_len = val._M_len;
  if ((char *)local_68._M_len == (char *)0x0) {
    std::vector<double,_std::allocator<double>_>::resize(data,0);
    return;
  }
  cVar1 = *local_68._M_str;
  if (cVar1 != 'v') {
    if (cVar1 == 'c') {
      iVar5 = readSize(val);
      std::vector<double,_std::allocator<double>_>::reserve(data,(long)iVar5 * 2);
      std::vector<double,_std::allocator<double>_>::resize(data,0);
      pcVar9 = local_68._M_str;
      if ((char *)local_68._M_len == (char *)0x0) {
        sVar7 = 0xffffffffffffffff;
      }
      else {
        pvVar6 = memchr(local_68._M_str,0x5b,local_68._M_len);
        sVar7 = -(ulong)(pvVar6 == (void *)0x0) | (long)pvVar6 - (long)pcVar9;
      }
      if (iVar5 < 1) {
        return;
      }
      while( true ) {
        pcVar9 = (char *)(sVar7 + 1);
        sVar8 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                          (&local_68,",;]",(size_type)pcVar9,3);
        if (local_68._M_len < pcVar9) break;
        uVar10 = ~sVar7 + sVar8;
        if (local_68._M_len - (long)pcVar9 < ~sVar7 + sVar8) {
          uVar10 = local_68._M_len - (long)pcVar9;
        }
        val_00._M_str = pcVar9 + (long)local_68._M_str;
        val_00._M_len = uVar10;
        helicsGetComplex(val_00);
        iVar2._M_current =
             (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_58 = in_XMM1_Qa;
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (data,iVar2,(double *)&local_50);
          in_XMM1_Qa = local_58;
        }
        else {
          *iVar2._M_current = extraout_XMM0_Qa_00;
          (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        iVar2._M_current =
             (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        local_50 = in_XMM1_Qa;
        if (iVar2._M_current ==
            (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (data,iVar2,(double *)&local_50);
        }
        else {
          *iVar2._M_current = (double)in_XMM1_Qa;
          (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        iVar5 = iVar5 + -1;
        sVar7 = sVar8;
        if (iVar5 == 0) {
          return;
        }
      }
LAB_00235af6:
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 pcVar9);
    }
    if (cVar1 != '[') {
      helicsGetComplex(val);
      local_58 = (utilities *)extraout_XMM0_Qa;
      if (((double)in_XMM1_Qa == 0.0) && (!NAN((double)in_XMM1_Qa))) {
        std::vector<double,_std::allocator<double>_>::resize(data,1);
        *(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
         ._M_start = (double)local_58;
        return;
      }
      local_40 = in_XMM1_Qa;
      std::vector<double,_std::allocator<double>_>::resize(data,2);
      pdVar3 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *pdVar3 = (double)local_58;
      pdVar3[1] = (double)local_40;
      return;
    }
  }
  uVar4 = readSize(val);
  if (0 < (int)uVar4) {
    std::vector<double,_std::allocator<double>_>::reserve(data,(ulong)uVar4);
  }
  std::vector<double,_std::allocator<double>_>::resize(data,0);
  pcVar9 = local_68._M_str;
  if ((char *)local_68._M_len == (char *)0x0) {
    uVar10 = 0xffffffffffffffff;
  }
  else {
    pvVar6 = memchr(local_68._M_str,0x5b,local_68._M_len);
    uVar10 = -(ulong)(pvVar6 == (void *)0x0) | (long)pvVar6 - (long)pcVar9;
  }
  if (0 < (int)uVar4) {
    do {
      pcVar9 = (char *)(uVar10 + 1);
      sVar7 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                        (&local_68,";,]",(size_type)pcVar9,3);
      if (local_68._M_len < pcVar9) goto LAB_00235af6;
      local_50 = (utilities *)(~uVar10 + sVar7);
      if ((utilities *)(local_68._M_len + -(long)pcVar9) < (utilities *)(~uVar10 + sVar7)) {
        local_50 = (utilities *)(local_68._M_len + -(long)pcVar9);
      }
      local_48 = pcVar9 + (long)local_68._M_str;
      trimCharacters._M_str = (char *)local_68._M_len;
      trimCharacters._M_len = (size_t)" \t\n\r";
      gmlc::utilities::string_viewOps::trimString
                ((string_viewOps *)&local_50,(string_view *)0x4,trimCharacters);
      V._M_str = extraout_RDX;
      V._M_len = (size_t)local_48;
      local_38 = gmlc::utilities::numeric_conversion<double>(local_50,V,-1e+49);
      iVar2._M_current =
           (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)data,iVar2,&local_38);
      }
      else {
        *iVar2._M_current = local_38;
        (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      uVar4 = uVar4 - 1;
      uVar10 = sVar7;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void helicsGetVector(std::string_view val, std::vector<double>& data)
{
    if (val.empty()) {
        data.resize(0);
        return;
    }
    if (val.front() == 'v' || val.front() == '[') {
        auto size = readSize(val);
        if (size > 0) {
            data.reserve(size);
        }
        data.resize(0);
        auto firstBracket = val.find_first_of('[');
        for (decltype(size) ii = 0; ii < size; ++ii) {
            auto nextChar = val.find_first_of(";,]", firstBracket + 1);

            auto vstr = val.substr(firstBracket + 1, nextChar - firstBracket - 1);
            string_viewOps::trimString(vstr);
            auto vectorVal = numeric_conversion<double>(vstr, invalidValue<double>());
            data.push_back(vectorVal);

            firstBracket = nextChar;
        }
    } else if (val.front() == 'c') {
        auto size = readSize(val);
        data.reserve(static_cast<std::size_t>(size) * 2);
        data.resize(0);
        auto firstBracket = val.find_first_of('[');
        for (decltype(size) ii = 0; ii < size; ++ii) {
            auto nextChar = val.find_first_of(",;]", firstBracket + 1);
            auto vectorVal =
                helicsGetComplex(val.substr(firstBracket + 1, nextChar - firstBracket - 1));
            data.push_back(vectorVal.real());
            data.push_back(vectorVal.imag());
            firstBracket = nextChar;
        }
    } else {
        auto cval = helicsGetComplex(val);
        if (cval.imag() == 0) {
            data.resize(1);
            data[0] = cval.real();
        } else {
            data.resize(2);
            data[0] = cval.real();
            data[1] = cval.imag();
        }
    }
}